

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.c
# Opt level: O1

apx_error_t apx_vm_serializer_queued_write_end(apx_vm_serializer_t *self)

{
  uint8_t *begin;
  uint32_t value_size;
  apx_error_t aVar1;
  
  if (self == (apx_vm_serializer_t *)0x0) {
    aVar1 = 1;
  }
  else {
    aVar1 = 6;
    if ((self->queued_write_state).is_active == true) {
      (self->queued_write_state).is_active = false;
      value_size = apx_vm_size_type_to_size((self->queued_write_state).size_type);
      begin = (self->queued_write_state).length_ptr;
      aVar1 = write_dynamic_value_to_buffer
                        (begin,begin + value_size,(self->queued_write_state).current_length,
                         value_size);
      return aVar1;
    }
  }
  return aVar1;
}

Assistant:

apx_error_t apx_vm_serializer_queued_write_end(apx_vm_serializer_t* self)
{
   if (self != NULL)
   {
      if (!self->queued_write_state.is_active)
      {
         return APX_INTERNAL_ERROR;
      }
      self->queued_write_state.is_active = false;
      uint32_t const value_size = apx_vm_size_type_to_size(self->queued_write_state.size_type);
      apx_error_t retval = write_dynamic_value_to_buffer(self->queued_write_state.length_ptr,
         self->queued_write_state.length_ptr + value_size, self->queued_write_state.current_length, value_size);
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}